

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_settings.cpp
# Opt level: O0

void libtorrent::aux::anon_unknown_3::init<libtorrent::settings_pack>
               (proxy_settings *p,settings_pack *sett)

{
  bool bVar1;
  int iVar2;
  string *psVar3;
  settings_pack *sett_local;
  proxy_settings *p_local;
  
  psVar3 = settings_pack::get_str_abi_cxx11_(sett,6);
  ::std::__cxx11::string::operator=((string *)p,(string *)psVar3);
  psVar3 = settings_pack::get_str_abi_cxx11_(sett,7);
  ::std::__cxx11::string::operator=((string *)&p->username,(string *)psVar3);
  psVar3 = settings_pack::get_str_abi_cxx11_(sett,8);
  ::std::__cxx11::string::operator=((string *)&p->password,(string *)psVar3);
  iVar2 = settings_pack::get_int(sett,0x407b);
  p->type = (proxy_type_t)iVar2;
  iVar2 = settings_pack::get_int(sett,0x407c);
  p->port = (uint16_t)iVar2;
  bVar1 = settings_pack::get_bool(sett,0x8040);
  p->proxy_hostnames = bVar1;
  bVar1 = settings_pack::get_bool(sett,0x8041);
  p->proxy_peer_connections = bVar1;
  bVar1 = settings_pack::get_bool(sett,0x8043);
  p->proxy_tracker_connections = bVar1;
  return;
}

Assistant:

void init(proxy_settings& p, Settings const& sett)
{
	p.hostname = sett.get_str(settings_pack::proxy_hostname);
	p.username = sett.get_str(settings_pack::proxy_username);
	p.password = sett.get_str(settings_pack::proxy_password);
	p.type = settings_pack::proxy_type_t(sett.get_int(settings_pack::proxy_type));
	p.port = std::uint16_t(sett.get_int(settings_pack::proxy_port));
	p.proxy_hostnames = sett.get_bool(settings_pack::proxy_hostnames);
	p.proxy_peer_connections = sett.get_bool(
		settings_pack::proxy_peer_connections);
	p.proxy_tracker_connections = sett.get_bool(
		settings_pack::proxy_tracker_connections);
}